

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_compare.cpp
# Opt level: O0

bool ON_String::EqualPath(char *path1,int element_count1,char *path2,int element_count2)

{
  bool bVar1;
  char cVar2;
  char cVar3;
  uint uVar4;
  uint local_48;
  int local_40;
  bool bOrdinalIgnoreCase;
  int i;
  int element_count;
  uint c2;
  uint c1;
  char null_terminator;
  char *pcStack_28;
  int element_count2_local;
  char *path2_local;
  char *pcStack_18;
  int element_count1_local;
  char *path1_local;
  
  if (((path1 == (char *)0x0) && (element_count1 != 0)) ||
     ((path2 == (char *)0x0 && (element_count2 != 0)))) {
    if (path1 == path2) {
      return true;
    }
    if (path1 == (char *)0x0) {
      return false;
    }
    if (path2 == (char *)0x0) {
      return false;
    }
  }
  c2._3_1_ = 0;
  c1 = element_count2;
  pcStack_28 = path2;
  path2_local._4_4_ = element_count1;
  pcStack_18 = path1;
  if (element_count1 < 0) {
    path2_local._4_4_ = Length(path1);
  }
  if ((int)c1 < 0) {
    c1 = Length(pcStack_28);
  }
  if (path2_local._4_4_ == 0) {
    pcStack_18 = (char *)((long)&c2 + 3);
  }
  if (c1 == 0) {
    pcStack_28 = (char *)((long)&c2 + 3);
  }
  if ((pcStack_18 != pcStack_28) || (path2_local._4_4_ != c1)) {
    if ((int)c1 < (int)path2_local._4_4_) {
      local_48 = c1;
    }
    else {
      local_48 = path2_local._4_4_;
    }
    bVar1 = ON_FileSystemPath::PlatformPathIgnoreCase();
    if (bVar1) {
      for (local_40 = 0; local_40 < (int)local_48; local_40 = local_40 + 1) {
        cVar3 = *pcStack_18;
        pcStack_18 = pcStack_18 + 1;
        uVar4 = OrdinalUTF8ToIgnoreCase(cVar3);
        cVar2 = ON_NormalizeUTF8PathSepartor((char)uVar4);
        cVar3 = *pcStack_28;
        pcStack_28 = pcStack_28 + 1;
        uVar4 = OrdinalUTF8ToIgnoreCase(cVar3);
        cVar3 = ON_NormalizeUTF8PathSepartor((char)uVar4);
        if (cVar2 != cVar3) {
          return false;
        }
      }
    }
    else {
      for (local_40 = 0; local_40 < (int)local_48; local_40 = local_40 + 1) {
        cVar3 = *pcStack_18;
        pcStack_18 = pcStack_18 + 1;
        cVar2 = ON_NormalizeUTF8PathSepartor(cVar3);
        cVar3 = *pcStack_28;
        pcStack_28 = pcStack_28 + 1;
        cVar3 = ON_NormalizeUTF8PathSepartor(cVar3);
        if (cVar2 != cVar3) {
          return false;
        }
      }
    }
    for (; local_40 < (int)path2_local._4_4_; local_40 = local_40 + 1) {
      if (*pcStack_18 != '\0') {
        return false;
      }
      pcStack_18 = pcStack_18 + 1;
    }
    for (; local_40 < (int)c1; local_40 = local_40 + 1) {
      if (*pcStack_28 != '\0') {
        return false;
      }
      pcStack_28 = pcStack_28 + 1;
    }
  }
  return true;
}

Assistant:

bool ON_String::EqualPath(
  const char* path1,
  int element_count1,
  const char* path2,
  int element_count2
  )
{
  CHAR_STRING_EQUAL_PREAMBLE(path1,element_count1,path2,element_count2);

  unsigned int c1=0, c2=0;
  const int element_count
    = (element_count1 <= element_count2)
    ? element_count1
    : element_count2;
  int i;
  const bool bOrdinalIgnoreCase = ON_FileSystemPath::PlatformPathIgnoreCase();

  if (bOrdinalIgnoreCase)
  {
    for(i=0; i < element_count; i++)
    {
      c1 = ON_NormalizeUTF8PathSepartor((char)OrdinalUTF8ToIgnoreCase(*path1++));
      c2 = ON_NormalizeUTF8PathSepartor((char)OrdinalUTF8ToIgnoreCase(*path2++));
      if ( c1 != c2 )
        return false;
    }
  }
  else
  {
    for(i=0; i < element_count; i++)
    {
      c1 = ON_NormalizeUTF8PathSepartor(*path1++);
      c2 = ON_NormalizeUTF8PathSepartor(*path2++);
      if ( c1 != c2 )
        return false;
    }
  }

  for (/*empty init*/; i < element_count1; i++)
  {
    if ( 0 != (*path1++))
      return false;
  }

  for (/*empty init*/; i < element_count2; i++)
  {
    if ( 0 != (*path2++))
      return false;
  }

  return true;
}